

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_buffered_batch_collector.cpp
# Opt level: O2

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalBufferedBatchCollector::GetGlobalSinkState
          (PhysicalBufferedBatchCollector *this,ClientContext *context)

{
  pointer pBVar1;
  pointer *__ptr;
  __uniq_ptr_impl<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
  local_28;
  __shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  make_uniq<duckdb::BufferedBatchCollectorGlobalState>();
  enable_shared_from_this<duckdb::ClientContext>::shared_from_this
            ((enable_shared_from_this<duckdb::ClientContext> *)&local_20);
  pBVar1 = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                         *)&local_28);
  ::std::__weak_ptr<duckdb::ClientContext,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__weak_ptr<duckdb::ClientContext,(__gnu_cxx::_Lock_policy)2> *)&pBVar1->context,
             &local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
  ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                *)&local_28);
  make_shared_ptr<duckdb::BatchedBufferedData,duckdb::weak_ptr<duckdb::ClientContext,true>&>
            ((weak_ptr<duckdb::ClientContext,_true> *)&local_20);
  pBVar1 = unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::BufferedBatchCollectorGlobalState,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>,_true>
                         *)&local_28);
  shared_ptr<duckdb::BufferedData,_true>::operator=<duckdb::BatchedBufferedData,_0>
            (&pBVar1->buffered_data,(shared_ptr<duckdb::BatchedBufferedData,_true> *)&local_20);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  (this->super_PhysicalResultCollector).super_PhysicalOperator._vptr_PhysicalOperator =
       (_func_int **)
       local_28._M_t.
       super__Tuple_impl<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_std::default_delete<duckdb::BufferedBatchCollectorGlobalState>_>
       .super__Head_base<0UL,_duckdb::BufferedBatchCollectorGlobalState_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalBufferedBatchCollector::GetGlobalSinkState(ClientContext &context) const {
	auto state = make_uniq<BufferedBatchCollectorGlobalState>();
	state->context = context.shared_from_this();
	state->buffered_data = make_shared_ptr<BatchedBufferedData>(state->context);
	return std::move(state);
}